

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O0

void aom_highbd_filter_block1d16_v4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  int16_t *in_stack_00000190;
  uint32_t in_stack_0000019c;
  ptrdiff_t in_stack_000001a0;
  uint16_t *in_stack_000001a8;
  ptrdiff_t in_stack_000001b0;
  uint16_t *in_stack_000001b8;
  int in_stack_00000770;
  
  aom_highbd_filter_block1d8_v4_sse2
            (in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
             in_stack_0000019c,in_stack_00000190,in_stack_00000770);
  aom_highbd_filter_block1d8_v4_sse2
            (in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
             in_stack_0000019c,in_stack_00000190,in_stack_00000770);
  return;
}

Assistant:

static void aom_highbd_filter_block1d16_v4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  aom_highbd_filter_block1d8_v4_sse2(src_ptr, src_pitch, dst_ptr, dst_pitch,
                                     height, filter, bd);
  aom_highbd_filter_block1d8_v4_sse2((src_ptr + 8), src_pitch, (dst_ptr + 8),
                                     dst_pitch, height, filter, bd);
}